

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O0

void Omega_h::carry_class_bdry_integ_error
               (Mesh *old_mesh,Mesh *new_mesh,Cavs *class_bdry_cavs,string *error_name,
               Write<double> *new_elem_errors_w)

{
  Int IVar1;
  Tag<double> *this;
  Write<double> local_260;
  Read<int> local_250;
  Read<double> local_240;
  allocator local_229;
  string local_228 [32];
  Read<double> local_208;
  Read<double> local_1f8;
  Write<double> local_1e8;
  undefined1 local_1d8 [8];
  Reals cav_elem_errors;
  Read<double> local_1b8;
  undefined1 local_1a8 [8];
  Read<double> cav_elem_error_densities;
  Read<double> local_188;
  undefined1 local_178 [8];
  Reals cav_error_densities;
  Read<int> local_158;
  undefined1 local_148 [8];
  Read<double> new_cav_sizes;
  Graph local_128;
  undefined1 local_108 [8];
  Read<double> old_cav_errors;
  Read<double> old_elem_errors;
  Int ncomps;
  Tag<double> *old_tag;
  Read<int> local_c8;
  Write<signed_char> local_b8;
  undefined1 local_a8 [8];
  Read<double> new_cav_elem_sizes;
  Reals new_elem_sizes;
  undefined1 local_78 [8];
  Graph keys2new;
  Graph keys2old;
  Int dim;
  Write<double> *new_elem_errors_w_local;
  string *error_name_local;
  Cavs *class_bdry_cavs_local;
  Mesh *new_mesh_local;
  Mesh *old_mesh_local;
  
  IVar1 = Mesh::dim(old_mesh);
  Graph::Graph((Graph *)&keys2new.ab2b.write_.shared_alloc_.direct_ptr,
               &class_bdry_cavs->keys2old_elems);
  Graph::Graph((Graph *)local_78,&class_bdry_cavs->keys2new_elems);
  Mesh::ask_sizes((Mesh *)&new_cav_elem_sizes.write_.shared_alloc_.direct_ptr);
  Read<int>::Read(&local_c8,(Read<int> *)&keys2new.a2ab.write_.shared_alloc_.direct_ptr);
  Read<double>::Read((Read<double> *)&old_tag,
                     (Read<double> *)&new_cav_elem_sizes.write_.shared_alloc_.direct_ptr);
  unmap<double>((Omega_h *)&local_b8,&local_c8,(Read<signed_char> *)&old_tag,1);
  read<double>((Omega_h *)local_a8,&local_b8);
  Write<double>::~Write((Write<double> *)&local_b8);
  Read<double>::~Read((Read<double> *)&old_tag);
  Read<int>::~Read(&local_c8);
  this = Mesh::get_tag<double>(old_mesh,IVar1,error_name);
  IVar1 = TagBase::ncomps(&this->super_TagBase);
  Tag<double>::array((Tag<double> *)&old_cav_errors.write_.shared_alloc_.direct_ptr);
  Graph::Graph(&local_128,(Graph *)&keys2new.ab2b.write_.shared_alloc_.direct_ptr);
  Read<double>::Read((Read<double> *)&new_cav_sizes.write_.shared_alloc_.direct_ptr,
                     (Read<double> *)&old_cav_errors.write_.shared_alloc_.direct_ptr);
  graph_reduce<double>
            ((Omega_h *)local_108,&local_128,
             (Read<double> *)&new_cav_sizes.write_.shared_alloc_.direct_ptr,IVar1,OMEGA_H_SUM);
  Read<double>::~Read((Read<double> *)&new_cav_sizes.write_.shared_alloc_.direct_ptr);
  Graph::~Graph(&local_128);
  Read<int>::Read(&local_158,(Read<int> *)local_78);
  Read<double>::Read((Read<double> *)&cav_error_densities.write_.shared_alloc_.direct_ptr,
                     (Read<double> *)local_a8);
  fan_reduce<double>((Omega_h *)local_148,&local_158,
                     (Read<signed_char> *)&cav_error_densities.write_.shared_alloc_.direct_ptr,1,
                     OMEGA_H_SUM);
  Read<double>::~Read((Read<double> *)&cav_error_densities.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read(&local_158);
  Read<double>::Read(&local_188,(Read<double> *)local_108);
  Read<double>::Read((Read<double> *)&cav_elem_error_densities.write_.shared_alloc_.direct_ptr,
                     (Read<double> *)local_148);
  divide_each_maybe_zero
            ((Omega_h *)local_178,&local_188,
             (Reals *)&cav_elem_error_densities.write_.shared_alloc_.direct_ptr);
  Read<double>::~Read((Read<double> *)&cav_elem_error_densities.write_.shared_alloc_.direct_ptr);
  Read<double>::~Read(&local_188);
  Read<double>::Read(&local_1b8,(Read<double> *)local_178);
  Read<int>::Read((Read<int> *)&cav_elem_errors.write_.shared_alloc_.direct_ptr,
                  (Read<int> *)local_78);
  expand<double>((Omega_h *)local_1a8,(Read<signed_char> *)&local_1b8,
                 (LOs *)&cav_elem_errors.write_.shared_alloc_.direct_ptr,IVar1);
  Read<int>::~Read((Read<int> *)&cav_elem_errors.write_.shared_alloc_.direct_ptr);
  Read<double>::~Read(&local_1b8);
  Read<double>::Read(&local_1f8,(Read<double> *)local_1a8);
  Read<double>::Read(&local_208,(Read<double> *)local_a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_228,"",&local_229);
  multiply_each<double>((Omega_h *)&local_1e8,&local_1f8,&local_208,(string *)local_228);
  Read<double>::Read((Read<double> *)local_1d8,&local_1e8);
  Write<double>::~Write(&local_1e8);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  Read<double>::~Read(&local_208);
  Read<double>::~Read(&local_1f8);
  Read<double>::Read(&local_240,(Read<double> *)local_1d8);
  Read<int>::Read(&local_250,(Read<int> *)&keys2new.a2ab.write_.shared_alloc_.direct_ptr);
  Write<double>::Write(&local_260,new_elem_errors_w);
  add_into<double>((Read<signed_char> *)&local_240,&local_250,(Write<signed_char> *)&local_260,IVar1
                  );
  Write<double>::~Write(&local_260);
  Read<int>::~Read(&local_250);
  Read<double>::~Read(&local_240);
  Read<double>::~Read((Read<double> *)local_1d8);
  Read<double>::~Read((Read<double> *)local_1a8);
  Read<double>::~Read((Read<double> *)local_178);
  Read<double>::~Read((Read<double> *)local_148);
  Read<double>::~Read((Read<double> *)local_108);
  Read<double>::~Read((Read<double> *)&old_cav_errors.write_.shared_alloc_.direct_ptr);
  Read<double>::~Read((Read<double> *)local_a8);
  Read<double>::~Read((Read<double> *)&new_cav_elem_sizes.write_.shared_alloc_.direct_ptr);
  Graph::~Graph((Graph *)local_78);
  Graph::~Graph((Graph *)&keys2new.ab2b.write_.shared_alloc_.direct_ptr);
  return;
}

Assistant:

static void carry_class_bdry_integ_error(Mesh* old_mesh, Mesh* new_mesh,
    Cavs class_bdry_cavs, std::string const& error_name,
    Write<Real> new_elem_errors_w) {
  auto dim = old_mesh->dim();
  auto keys2old = class_bdry_cavs.keys2old_elems;
  auto keys2new = class_bdry_cavs.keys2new_elems;
  auto new_elem_sizes = new_mesh->ask_sizes();
  auto new_cav_elem_sizes = read(unmap(keys2new.ab2b, new_elem_sizes, 1));
  auto old_tag = old_mesh->get_tag<Real>(dim, error_name);
  auto ncomps = old_tag->ncomps();
  auto old_elem_errors = old_tag->array();
  auto old_cav_errors =
      graph_reduce(keys2old, old_elem_errors, ncomps, OMEGA_H_SUM);
  auto new_cav_sizes =
      fan_reduce(keys2new.a2ab, new_cav_elem_sizes, 1, OMEGA_H_SUM);
  auto cav_error_densities =
      divide_each_maybe_zero(old_cav_errors, new_cav_sizes);
  auto cav_elem_error_densities =
      expand(cav_error_densities, keys2new.a2ab, ncomps);
  Reals cav_elem_errors =
      multiply_each(cav_elem_error_densities, new_cav_elem_sizes);
  add_into(cav_elem_errors, keys2new.ab2b, new_elem_errors_w, ncomps);
}